

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGPtr xmlRelaxNGParse(xmlRelaxNGParserCtxtPtr ctxt)

{
  xmlRelaxNGGrammarPtr_conflict pxVar1;
  xmlDocPtr pxVar2;
  xmlParserCtxtPtr ctxt_00;
  xmlChar *pxVar3;
  xmlNodePtr node;
  xmlRelaxNGPtr schema;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  char *pcVar5;
  int iVar6;
  
  xmlRelaxNGInitTypes();
  if (ctxt == (xmlRelaxNGParserCtxtPtr)0x0) {
    return (xmlRelaxNGPtr)0x0;
  }
  if (ctxt->URL == (xmlChar *)0x0) {
    pcVar5 = ctxt->buffer;
    if (pcVar5 == (char *)0x0) {
      pxVar2 = ctxt->document;
      if (pxVar2 != (xmlDocPtr)0x0) goto LAB_001836e5;
      pcVar5 = "xmlRelaxNGParse: nothing to parse\n";
      iVar6 = 0x3fe;
    }
    else {
      iVar6 = ctxt->size;
      ctxt_00 = xmlNewParserCtxt();
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        xmlRngPErrMemory(ctxt);
        pxVar2 = (xmlDocPtr)0x0;
      }
      else {
        if (ctxt->serror != (xmlStructuredErrorFunc)0x0) {
          xmlCtxtSetErrorHandler(ctxt_00,ctxt->serror,ctxt->userData);
        }
        if (ctxt->resourceLoader != (xmlResourceLoader)0x0) {
          xmlCtxtSetResourceLoader(ctxt_00,ctxt->resourceLoader,ctxt->resourceCtxt);
        }
        pxVar2 = xmlCtxtReadMemory(ctxt_00,pcVar5,iVar6,(char *)0x0,(char *)0x0,0);
        xmlFreeParserCtxt(ctxt_00);
      }
      if (pxVar2 != (xmlDocPtr)0x0) {
        pxVar3 = xmlStrdup((xmlChar *)"in_memory_buffer");
        pxVar2->URL = pxVar3;
        pxVar3 = xmlStrdup((xmlChar *)"in_memory_buffer");
        ctxt->URL = pxVar3;
LAB_001836e5:
        ctxt->document = pxVar2;
        pxVar2 = xmlRelaxNGCleanupDoc(ctxt,pxVar2);
        if (pxVar2 != (xmlDocPtr)0x0) {
          node = xmlDocGetRootElement(pxVar2);
          if (node == (xmlNodePtr)0x0) {
            pxVar3 = (xmlChar *)"schemas";
            if (ctxt->URL != (xmlChar *)0x0) {
              pxVar3 = ctxt->URL;
            }
            xmlRngPErr(ctxt,(xmlNodePtr)pxVar2,0x3fe,"xmlRelaxNGParse: %s is empty\n",pxVar3,
                       (xmlChar *)0x0);
            xmlFreeDoc(ctxt->document);
            ctxt->document = (xmlDocPtr)0x0;
            return (xmlRelaxNGPtr)0x0;
          }
          schema = xmlRelaxNGParseDocument(ctxt,node);
          if (schema != (xmlRelaxNGPtr)0x0) {
            if (ctxt->interleaves != (xmlHashTablePtr)0x0) {
              xmlHashScan(ctxt->interleaves,xmlRelaxNGComputeInterleaves,ctxt);
            }
            if (0 < ctxt->nbErrors) {
              xmlRelaxNGFree(schema);
              ctxt->document = (xmlDocPtr)0x0;
              xmlFreeDoc(pxVar2);
              return (xmlRelaxNGPtr)0x0;
            }
            if ((schema->topgrammar != (xmlRelaxNGGrammarPtr_conflict)0x0) &&
               (pxVar4 = schema->topgrammar->start, pxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
              if ((pxVar4->type != XML_RELAXNG_START) &&
                 (pxVar4 = xmlRelaxNGNewDefine(ctxt,(xmlNodePtr)0x0),
                 pxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
                pxVar4->type = XML_RELAXNG_START;
                pxVar1 = schema->topgrammar;
                pxVar4->content = pxVar1->start;
                pxVar1->start = pxVar4;
              }
              xmlRelaxNGTryCompile(ctxt,schema->topgrammar->start);
            }
            schema->doc = pxVar2;
            ctxt->document = (xmlDocPtr)0x0;
            schema->documents = ctxt->documents;
            ctxt->documents = (xmlRelaxNGDocumentPtr_conflict)0x0;
            schema->includes = ctxt->includes;
            ctxt->includes = (xmlRelaxNGIncludePtr_conflict)0x0;
            schema->defNr = ctxt->defNr;
            schema->defTab = ctxt->defTab;
            ctxt->defTab = (xmlRelaxNGDefinePtr_conflict *)0x0;
            if (ctxt->idref == 1) {
              schema->idref = 1;
              return schema;
            }
            return schema;
          }
        }
        xmlFreeDoc(ctxt->document);
        ctxt->document = (xmlDocPtr)0x0;
        return (xmlRelaxNGPtr)0x0;
      }
      pcVar5 = "xmlRelaxNGParse: could not parse schemas\n";
      iVar6 = 0x429;
    }
    pxVar3 = (xmlChar *)0x0;
  }
  else {
    pxVar2 = xmlRelaxReadFile(ctxt,(char *)ctxt->URL);
    if (pxVar2 != (xmlDoc *)0x0) goto LAB_001836e5;
    pxVar3 = ctxt->URL;
    pcVar5 = "xmlRelaxNGParse: could not load %s\n";
    iVar6 = 0x429;
  }
  xmlRngPErr(ctxt,(xmlNodePtr)0x0,iVar6,pcVar5,pxVar3,(xmlChar *)0x0);
  return (xmlRelaxNGPtr)0x0;
}

Assistant:

xmlRelaxNGPtr
xmlRelaxNGParse(xmlRelaxNGParserCtxtPtr ctxt)
{
    xmlRelaxNGPtr ret = NULL;
    xmlDocPtr doc;
    xmlNodePtr root;

    xmlRelaxNGInitTypes();

    if (ctxt == NULL)
        return (NULL);

    /*
     * First step is to parse the input document into an DOM/Infoset
     */
    if (ctxt->URL != NULL) {
        doc = xmlRelaxReadFile(ctxt, (const char *) ctxt->URL);
        if (doc == NULL) {
            xmlRngPErr(ctxt, NULL, XML_RNGP_PARSE_ERROR,
                       "xmlRelaxNGParse: could not load %s\n", ctxt->URL,
                       NULL);
            return (NULL);
        }
    } else if (ctxt->buffer != NULL) {
        doc = xmlRelaxReadMemory(ctxt, ctxt->buffer, ctxt->size);
        if (doc == NULL) {
            xmlRngPErr(ctxt, NULL, XML_RNGP_PARSE_ERROR,
                       "xmlRelaxNGParse: could not parse schemas\n", NULL,
                       NULL);
            return (NULL);
        }
        doc->URL = xmlStrdup(BAD_CAST "in_memory_buffer");
        ctxt->URL = xmlStrdup(BAD_CAST "in_memory_buffer");
    } else if (ctxt->document != NULL) {
        doc = ctxt->document;
    } else {
        xmlRngPErr(ctxt, NULL, XML_RNGP_EMPTY,
                   "xmlRelaxNGParse: nothing to parse\n", NULL, NULL);
        return (NULL);
    }
    ctxt->document = doc;

    /*
     * Some preprocessing of the document content
     */
    doc = xmlRelaxNGCleanupDoc(ctxt, doc);
    if (doc == NULL) {
        xmlFreeDoc(ctxt->document);
        ctxt->document = NULL;
        return (NULL);
    }

    /*
     * Then do the parsing for good
     */
    root = xmlDocGetRootElement(doc);
    if (root == NULL) {
        xmlRngPErr(ctxt, (xmlNodePtr) doc,
	           XML_RNGP_EMPTY, "xmlRelaxNGParse: %s is empty\n",
                   (ctxt->URL ? ctxt->URL : BAD_CAST "schemas"), NULL);

        xmlFreeDoc(ctxt->document);
        ctxt->document = NULL;
        return (NULL);
    }
    ret = xmlRelaxNGParseDocument(ctxt, root);
    if (ret == NULL) {
        xmlFreeDoc(ctxt->document);
        ctxt->document = NULL;
        return (NULL);
    }

    /*
     * Check the ref/defines links
     */
    /*
     * try to preprocess interleaves
     */
    if (ctxt->interleaves != NULL) {
        xmlHashScan(ctxt->interleaves, xmlRelaxNGComputeInterleaves, ctxt);
    }

    /*
     * if there was a parsing error return NULL
     */
    if (ctxt->nbErrors > 0) {
        xmlRelaxNGFree(ret);
        ctxt->document = NULL;
        xmlFreeDoc(doc);
        return (NULL);
    }

    /*
     * try to compile (parts of) the schemas
     */
    if ((ret->topgrammar != NULL) && (ret->topgrammar->start != NULL)) {
        if (ret->topgrammar->start->type != XML_RELAXNG_START) {
            xmlRelaxNGDefinePtr def;

            def = xmlRelaxNGNewDefine(ctxt, NULL);
            if (def != NULL) {
                def->type = XML_RELAXNG_START;
                def->content = ret->topgrammar->start;
                ret->topgrammar->start = def;
            }
        }
        xmlRelaxNGTryCompile(ctxt, ret->topgrammar->start);
    }

    /*
     * Transfer the pointer for cleanup at the schema level.
     */
    ret->doc = doc;
    ctxt->document = NULL;
    ret->documents = ctxt->documents;
    ctxt->documents = NULL;

    ret->includes = ctxt->includes;
    ctxt->includes = NULL;
    ret->defNr = ctxt->defNr;
    ret->defTab = ctxt->defTab;
    ctxt->defTab = NULL;
    if (ctxt->idref == 1)
        ret->idref = 1;

    return (ret);
}